

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O1

Io_MvVar_t * Abc_NtkMvVarDup(Abc_Ntk_t *pNtk,Io_MvVar_t *pVar)

{
  void *pvVar1;
  Io_MvVar_t *pIVar2;
  char **ppcVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  Mem_Flex_t *p;
  
  if (pVar == (Io_MvVar_t *)0x0) {
    pIVar2 = (Io_MvVar_t *)0x0;
  }
  else {
    if (pNtk->vAttrs->nSize < 0xd) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar1 = pNtk->vAttrs->pArray[0xc];
    if (pvVar1 == (void *)0x0) {
      p = (Mem_Flex_t *)0x0;
    }
    else {
      p = *(Mem_Flex_t **)((long)pvVar1 + 0x10);
    }
    if (p == (Mem_Flex_t *)0x0) {
      __assert_fail("pFlex != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioReadBlifMv.c"
                    ,0x88d,"Io_MvVar_t *Abc_NtkMvVarDup(Abc_Ntk_t *, Io_MvVar_t *)");
    }
    pIVar2 = (Io_MvVar_t *)Mem_FlexEntryFetch(p,0x10);
    pIVar2->nValues = pVar->nValues;
    pIVar2->pNames = (char **)0x0;
    if (pVar->pNames != (char **)0x0) {
      ppcVar3 = (char **)Mem_FlexEntryFetch(p,pVar->nValues << 3);
      pIVar2->pNames = ppcVar3;
      if (0 < pVar->nValues) {
        lVar6 = 0;
        do {
          sVar4 = strlen(pVar->pNames[lVar6]);
          pcVar5 = Mem_FlexEntryFetch(p,(int)sVar4 + 1);
          pIVar2->pNames[lVar6] = pcVar5;
          strcpy(pIVar2->pNames[lVar6],pVar->pNames[lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < pVar->nValues);
      }
    }
  }
  return pIVar2;
}

Assistant:

Io_MvVar_t * Abc_NtkMvVarDup( Abc_Ntk_t * pNtk, Io_MvVar_t * pVar )
{
    Mem_Flex_t * pFlex;
    Io_MvVar_t * pVarDup;
    int i;
    if ( pVar == NULL )
        return NULL;
    pFlex = (Mem_Flex_t *)Abc_NtkMvVarMan( pNtk );
    assert( pFlex != NULL );
    pVarDup = (Io_MvVar_t *)Mem_FlexEntryFetch( pFlex, sizeof(Io_MvVar_t) );
    pVarDup->nValues = pVar->nValues;
    pVarDup->pNames = NULL;
    if ( pVar->pNames == NULL )
        return pVarDup;
    pVarDup->pNames = (char **)Mem_FlexEntryFetch( pFlex, sizeof(char *) * pVar->nValues );
    for ( i = 0; i < pVar->nValues; i++ )
    {
        pVarDup->pNames[i] = (char *)Mem_FlexEntryFetch( pFlex, strlen(pVar->pNames[i]) + 1 );
        strcpy( pVarDup->pNames[i], pVar->pNames[i] );
    }
    return pVarDup;
}